

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 GenStateProcessStringExpression(jx9_gen_state *pGen,char *zIn,char *zEnd)

{
  sxi32 sVar1;
  SySet sToken;
  SySet local_60;
  SyToken *local_38;
  SyToken *pSStack_30;
  
  local_60.pAllocator = &pGen->pVm->sAllocator;
  local_60.nSize = 0;
  local_60.eSize = 0x20;
  local_60.nUsed = 0;
  local_60.nCursor = 0;
  local_60.pBase = (void *)0x0;
  local_60.pUserData = (void *)0x0;
  local_60.pBase = SyMemBackendAlloc(local_60.pAllocator,0x100);
  if ((SyToken *)local_60.pBase != (SyToken *)0x0) {
    local_60.nSize = 8;
  }
  jx9Tokenize(zIn,(int)zEnd - (int)zIn,&local_60);
  local_38 = pGen->pIn;
  pSStack_30 = pGen->pEnd;
  pGen->pIn = (SyToken *)local_60.pBase;
  pGen->pEnd = (SyToken *)((long)local_60.pBase + (ulong)local_60.nUsed * 0x20);
  sVar1 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
  pGen->pIn = local_38;
  pGen->pEnd = pSStack_30;
  if (((jx9_vm *)local_60.pAllocator != (jx9_vm *)0x0) &&
     ((SyToken *)local_60.pBase != (SyToken *)0x0)) {
    SyMemBackendFree(local_60.pAllocator,local_60.pBase);
  }
  return sVar1;
}

Assistant:

static sxi32 GenStateProcessStringExpression(
	jx9_gen_state *pGen, /* Code generator state */
	const char *zIn,     /* Raw expression */
	const char *zEnd     /* End of the expression */
	)
{
	SyToken *pTmpIn, *pTmpEnd;
	SySet sToken;
	sxi32 rc;
	/* Initialize the token set */
	SySetInit(&sToken, &pGen->pVm->sAllocator, sizeof(SyToken));
	/* Preallocate some slots */
	SySetAlloc(&sToken, 0x08);
	/* Tokenize the text */
	jx9Tokenize(zIn,(sxu32)(zEnd-zIn),&sToken);
	/* Swap delimiter */
	pTmpIn  = pGen->pIn;
	pTmpEnd = pGen->pEnd;
	pGen->pIn = (SyToken *)SySetBasePtr(&sToken);
	pGen->pEnd = &pGen->pIn[SySetUsed(&sToken)];
	/* Compile the expression */
	rc = jx9CompileExpr(&(*pGen), 0, 0);
	/* Restore token stream */
	pGen->pIn  = pTmpIn;
	pGen->pEnd = pTmpEnd;
	/* Release the token set */
	SySetRelease(&sToken);
	/* Compilation result */
	return rc;
}